

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionParser.cpp
# Opt level: O0

unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
unaryExpression(Tokenizer *tokenizer)

{
  bool bVar1;
  Token *pTVar2;
  __uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true> in_RSI;
  undefined1 local_50 [8];
  undefined1 local_48 [8];
  undefined1 local_40 [32];
  TokenType opType;
  unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> exp;
  Tokenizer *tokenizer_local;
  
  exp._M_t.super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>._M_t.
  super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
  super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl =
       (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>)
       (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>)
       in_RSI.super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>.
       _M_t.super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
       super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl;
  postfixExpression((Tokenizer *)&opType);
  bVar1 = std::operator!=((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                           *)&opType,(nullptr_t)0x0);
  if (bVar1) {
    std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::unique_ptr
              ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)tokenizer
               ,(unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)&opType)
    ;
    goto LAB_0017e8ba;
  }
  pTVar2 = Tokenizer::nextToken
                     ((Tokenizer *)
                      exp._M_t.
                      super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>
                      .super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl);
  local_40._24_4_ = pTVar2->type;
  postfixExpression((Tokenizer *)local_40);
  std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::operator=
            ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)&opType,
             (unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)local_40);
  std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
            ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)local_40);
  bVar1 = std::operator==((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                           *)&opType,(nullptr_t)0x0);
  if (bVar1) {
    std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>::
    unique_ptr<std::default_delete<ExpressionInternal>,void>
              ((unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>> *)tokenizer,
               (nullptr_t)0x0);
    goto LAB_0017e8ba;
  }
  if (local_40._24_4_ - Plus < 0x21 || local_40._24_4_ == Degree) {
    switch((long)&switchD_0017e7ff::switchdataD_00221c8c +
           (long)(int)(&switchD_0017e7ff::switchdataD_00221c8c)[local_40._24_4_ - Plus]) {
    case 0x17e801:
      std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::unique_ptr
                ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                 tokenizer,
                 (unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)&opType
                );
      break;
    case 0x17e81a:
      local_48._4_4_ = 0xb;
      std::
      make_unique<ExpressionInternal,OperatorType,std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>
                ((OperatorType *)tokenizer,
                 (unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                 (local_48 + 4));
      break;
    case 0x17e83d:
      local_48._0_4_ = 0xd;
      std::
      make_unique<ExpressionInternal,OperatorType,std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>
                ((OperatorType *)tokenizer,
                 (unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                 local_48);
      break;
    case 0x17e860:
      local_50._4_4_ = 0xc;
      std::
      make_unique<ExpressionInternal,OperatorType,std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>
                ((OperatorType *)tokenizer,
                 (unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                 (local_50 + 4));
      break;
    case 0x17e883:
      local_50._0_4_ = 0x1c;
      std::
      make_unique<ExpressionInternal,OperatorType,std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>
                ((OperatorType *)tokenizer,
                 (unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                 local_50);
      break;
    default:
      goto switchD_0017e7ff_caseD_17e8a6;
    }
  }
  else {
switchD_0017e7ff_caseD_17e8a6:
    std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>::
    unique_ptr<std::default_delete<ExpressionInternal>,void>
              ((unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>> *)tokenizer,
               (nullptr_t)0x0);
  }
LAB_0017e8ba:
  local_40._28_4_ = 1;
  std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
            ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)&opType);
  return (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>)
         (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>)
         tokenizer;
}

Assistant:

static std::unique_ptr<ExpressionInternal> unaryExpression(Tokenizer& tokenizer)
{
	std::unique_ptr<ExpressionInternal> exp = postfixExpression(tokenizer);
	if (exp != nullptr)
		return exp;

	const TokenType opType = tokenizer.nextToken().type;
	exp = postfixExpression(tokenizer);
	if (exp == nullptr)
		return nullptr;

	switch (opType)
	{
	case TokenType::Plus:
		return exp;
	case TokenType::Minus:
		return std::make_unique<ExpressionInternal>(OperatorType::Neg, std::move(exp));
	case TokenType::Tilde:
		return std::make_unique<ExpressionInternal>(OperatorType::BitNot, std::move(exp));
	case TokenType::Exclamation:
		return std::make_unique<ExpressionInternal>(OperatorType::LogNot, std::move(exp));
	case TokenType::Degree:
		return std::make_unique<ExpressionInternal>(OperatorType::ToString, std::move(exp));
	default:
		return nullptr;
	}
}